

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O0

void __thiscall
Centaurus::DryParserEM64T<unsigned_char>::DryParserEM64T
          (DryParserEM64T<unsigned_char> *this,Grammar<unsigned_char> *grammar,Logger *logger)

{
  bool bVar1;
  unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>_>
  *puVar2;
  Identifier *__k;
  reference pvVar3;
  mapped_type *pmVar4;
  socklen_t __len;
  CompositeATN<unsigned_char> *catn_00;
  sockaddr *__addr;
  pair<std::__detail::_Node_iterator<std::pair<const_Centaurus::Identifier,_asmjit::Label>,_false,_true>,_bool>
  pVar5;
  CodeHolder *in_stack_fffffffffffffb68;
  CodeHolder *in_stack_fffffffffffffb70;
  Logger *in_stack_fffffffffffffb78;
  uint32_t uVar6;
  CodeHolder *in_stack_fffffffffffffb80;
  Assembler *in_stack_fffffffffffffb88;
  value_type *p_1;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>_>
  *__range2_1;
  CompositeATN<unsigned_char> catn;
  Label local_3b8;
  reference local_3a8;
  value_type *p;
  const_iterator __end0;
  const_iterator __begin0;
  unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>_>
  *__range2;
  Label rejectlabel;
  undefined1 local_368 [8];
  MyConstPool pool;
  undefined1 local_230 [8];
  unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
  machine_map;
  X86Assembler as;
  Logger *logger_local;
  Grammar<unsigned_char> *grammar_local;
  DryParserEM64T<unsigned_char> *this_local;
  uint32_t signature;
  
  IParser::IParser(&this->super_IParser);
  (this->super_IParser)._vptr_IParser = (_func_int **)&PTR__DryParserEM64T_0028b6c0;
  asmjit::JitRuntime::JitRuntime((JitRuntime *)in_stack_fffffffffffffb70);
  asmjit::CodeHolder::CodeHolder(in_stack_fffffffffffffb70);
  asmjit::CodeHolder::init
            (&this->m_code,
             (EVP_PKEY_CTX *)&(this->m_runtime).super_HostRuntime.super_Runtime._codeInfo);
  if (logger != (Logger *)0x0) {
    asmjit::CodeHolder::setLogger(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  }
  uVar6 = (uint32_t)((ulong)in_stack_fffffffffffffb78 >> 0x20);
  asmjit::X86Assembler::X86Assembler
            ((X86Assembler *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  std::
  unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
  ::unordered_map((unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
                   *)local_230);
  emit_parser_prolog((X86Assembler *)&machine_map._M_h._M_single_bucket);
  pool.m_label.super_Operand.super_Operand_.field_0._mem.field_2 =
       (anon_union_8_2_78723da6_for_MemData_2)0x32;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)in_stack_fffffffffffffb80,uVar6,(Operand_ *)in_stack_fffffffffffffb70,
             (Operand_ *)in_stack_fffffffffffffb68);
  MyConstPool::MyConstPool
            ((MyConstPool *)local_368,(X86Assembler *)&machine_map._M_h._M_single_bucket);
  rejectlabel.super_Operand.super_Operand_.field_0._mem.field_2 =
       (anon_union_8_2_78723da6_for_MemData_2)0x110000149;
  MyConstPool::load_charclass_filter<unsigned_char>
            ((MyConstPool *)local_368,
             (X86Xmm *)((long)&rejectlabel.super_Operand.super_Operand_.field_0 + 8),
             (CharClass<unsigned_char> *)m_skipfilter);
  asmjit::Assembler::newLabel(in_stack_fffffffffffffb88);
  puVar2 = Grammar<unsigned_char>::get_machines(grammar);
  __end0 = std::
           unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>_>
           ::begin(puVar2);
  p = (value_type *)
      std::
      unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>_>
      ::end(puVar2);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end0.
                        super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                       ,(_Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                         *)&p);
    uVar6 = (uint32_t)((ulong)in_stack_fffffffffffffb68 >> 0x20);
    if (!bVar1) break;
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_false,_true>
             ::operator*(&__end0);
    local_3a8 = pvVar3;
    asmjit::Assembler::newLabel(in_stack_fffffffffffffb88);
    pVar5 = std::
            unordered_map<Centaurus::Identifier,asmjit::Label,std::hash<Centaurus::Identifier>,std::equal_to<Centaurus::Identifier>,std::allocator<std::pair<Centaurus::Identifier_const,asmjit::Label>>>
            ::emplace<Centaurus::Identifier_const&,asmjit::Label>
                      ((unordered_map<Centaurus::Identifier,asmjit::Label,std::hash<Centaurus::Identifier>,std::equal_to<Centaurus::Identifier>,std::allocator<std::pair<Centaurus::Identifier_const,asmjit::Label>>>
                        *)local_230,&pvVar3->first,&local_3b8);
    catn.m_dict._M_h._M_single_bucket =
         (__node_base_ptr)
         pVar5.first.
         super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_asmjit::Label>,_true>.
         _M_cur;
    std::__detail::
    _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_false,_true>
    ::operator++(&__end0);
  }
  __k = Grammar<unsigned_char>::get_root_id(grammar);
  std::
  unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
  ::operator[]((unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
                *)local_230,__k);
  catn_00 = (CompositeATN<unsigned_char> *)&machine_map._M_h._M_single_bucket;
  asmjit::CodeEmitter::emit((CodeEmitter *)in_stack_fffffffffffffb70,uVar6,(Operand_ *)0x174ca9);
  emit_parser_epilog((X86Assembler *)&machine_map._M_h._M_single_bucket,(Label *)&__range2);
  CompositeATN<unsigned_char>::CompositeATN((CompositeATN<unsigned_char> *)&__range2_1,grammar);
  puVar2 = Grammar<unsigned_char>::get_machines(grammar);
  __end0_1 = std::
             unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>_>
             ::begin(puVar2);
  p_1 = (value_type *)
        std::
        unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>_>
        ::end(puVar2);
  while( true ) {
    __len = (socklen_t)catn_00;
    bVar1 = std::__detail::operator!=
                      (&__end0_1.
                        super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                       ,(_Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                         *)&p_1);
    if (!bVar1) break;
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_false,_true>
             ::operator*(&__end0_1);
    pmVar4 = std::
             unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
             ::operator[]((unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
                           *)local_230,&pvVar3->first);
    asmjit::Assembler::bind
              ((Assembler *)&machine_map._M_h._M_single_bucket,(int)pmVar4,__addr,__len);
    catn_00 = (CompositeATN<unsigned_char> *)&__range2_1;
    emit_machine((X86Assembler *)&machine_map._M_h._M_single_bucket,&pvVar3->second,
                 (unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
                  *)local_230,catn_00,&pvVar3->first,(Label *)&__range2,(MyConstPool *)local_368);
    std::__detail::
    _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_false,_true>
    ::operator++(&__end0_1);
  }
  MyConstPool::embed((MyConstPool *)local_368);
  asmjit::CodeEmitter::finalize((CodeEmitter *)&machine_map._M_h._M_single_bucket);
  CompositeATN<unsigned_char>::~CompositeATN((CompositeATN<unsigned_char> *)&__range2_1);
  MyConstPool::~MyConstPool((MyConstPool *)local_368);
  std::
  unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
  ::~unordered_map((unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
                    *)local_230);
  asmjit::X86Assembler::~X86Assembler((X86Assembler *)0x174e3d);
  return;
}

Assistant:

DryParserEM64T<TCHAR>::DryParserEM64T(const Grammar<TCHAR>& grammar, asmjit::Logger *logger)
{
    m_code.init(m_runtime.getCodeInfo());
    if (logger != NULL)
        m_code.setLogger(logger);

    asmjit::X86Assembler as(&m_code);

    std::unordered_map<Identifier, asmjit::Label> machine_map;

    emit_parser_prolog(as);

    as.mov(INPUT_REG, asmjit::X86Mem(asmjit::x86::rsp, ARG1_STACK_OFFSET));

    MyConstPool pool(as);

    pool.load_charclass_filter(PATTERN_REG, m_skipfilter);

    asmjit::Label rejectlabel = as.newLabel();

    {
        for (const auto& p : grammar.get_machines())
        {
            machine_map.emplace(p.first, as.newLabel());
        }

        as.call(machine_map[grammar.get_root_id()]);
    }

    emit_parser_epilog(as, rejectlabel);

    CompositeATN<TCHAR> catn(grammar);

    for (const auto& p : grammar.get_machines())
    {
        as.bind(machine_map[p.first]);

        emit_machine(as, p.second, machine_map, catn, p.first, rejectlabel, pool);
    }

    pool.embed();

    as.finalize();
}